

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.cpp
# Opt level: O1

PAL_ERROR MAPRecordMapping(IPalObject *pMappingObject,void *pPEBaseAddress,void *addr,size_t len,
                          int prot)

{
  PAL_ERROR PVar1;
  _LIST_ENTRY *p_Var2;
  undefined4 uVar3;
  
  PVar1 = 0x54f;
  if (pPEBaseAddress != (void *)0x0) {
    p_Var2 = (_LIST_ENTRY *)CorUnix::InternalMalloc(0x38);
    PVar1 = 0x54f;
    if (p_Var2 != (_LIST_ENTRY *)0x0) {
      p_Var2[1].Blink = (_LIST_ENTRY *)addr;
      p_Var2[2].Flink = (_LIST_ENTRY *)len;
      uVar3 = 0;
      if ((((prot != 0) && (uVar3 = 6, (~prot & 3U) != 0)) && (uVar3 = 2, (prot & 2U) == 0)) &&
         (uVar3 = 4, (prot & 1U) == 0)) {
        uVar3 = 0;
        fprintf(_stderr,"] %s %s:%d","MAPMmapProtToAccessFlags",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/map/map.cpp"
                ,0x6ec);
        fprintf(_stderr,"Unknown Unix protection flag\n");
      }
      *(undefined4 *)&p_Var2[2].Blink = uVar3;
      (*pMappingObject->_vptr_IPalObject[7])(pMappingObject);
      p_Var2[1].Flink = (_LIST_ENTRY *)pMappingObject;
      p_Var2[3].Flink = (_LIST_ENTRY *)pPEBaseAddress;
      p_Var2->Flink = &MappedViewList;
      p_Var2->Blink = MappedViewList.Blink;
      (MappedViewList.Blink)->Flink = p_Var2;
      PVar1 = 0;
      MappedViewList.Blink = p_Var2;
      if (PAL_InitializeChakraCoreCalled == false) {
        abort();
      }
    }
  }
  return PVar1;
}

Assistant:

static PAL_ERROR
MAPRecordMapping(
    IPalObject *pMappingObject,
    void *pPEBaseAddress,
    void *addr,
    size_t len,
    int prot
    )
{
    if (pPEBaseAddress == NULL)
    {
        return ERROR_INTERNAL_ERROR;
    }

    PAL_ERROR palError = NO_ERROR;
    PMAPPED_VIEW_LIST pNewView;
    pNewView = (PMAPPED_VIEW_LIST)InternalMalloc(sizeof(*pNewView));
    if (NULL != pNewView)
    {
        pNewView->lpAddress = addr;
        pNewView->NumberOfBytesToMap = len;
        pNewView->dwDesiredAccess = MAPMmapProtToAccessFlags(prot);
        pMappingObject->AddReference();
        pNewView->pFileMapping = pMappingObject;
        pNewView->lpPEBaseAddress = pPEBaseAddress;
        InsertTailList(&MappedViewList, &pNewView->Link);

        TRACE_(LOADER)("Added address %p, size 0x%x, to the mapped file list.\n", addr, len);
    }
    else
    {
        palError = ERROR_INTERNAL_ERROR;
    }

    return palError;
}